

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QAbstractItemModelPrivate::Change>::moveAppend
          (QGenericArrayOps<QAbstractItemModelPrivate::Change> *this,Change *b,Change *e)

{
  qsizetype *pqVar1;
  Change *pCVar2;
  totally_ordered_wrapper<const_QAbstractItemModel_*> *ptVar3;
  Change *pCVar4;
  long lVar5;
  quintptr qVar6;
  undefined8 uVar7;
  undefined7 uVar8;
  int iVar9;
  int iVar10;
  
  if (b != e) {
    pCVar4 = (this->super_QArrayDataPointer<QAbstractItemModelPrivate::Change>).ptr;
    for (; b < e; b = b + 1) {
      lVar5 = (this->super_QArrayDataPointer<QAbstractItemModelPrivate::Change>).size;
      uVar8 = *(undefined7 *)&b->field_0x21;
      pCVar4[lVar5].needsAdjust = b->needsAdjust;
      *(undefined7 *)&pCVar4[lVar5].field_0x21 = uVar8;
      iVar9 = (b->parent).r;
      iVar10 = (b->parent).c;
      qVar6 = (b->parent).i;
      uVar7 = *(undefined8 *)&b->first;
      ptVar3 = &pCVar4[lVar5].parent.m;
      ptVar3->ptr = (b->parent).m.ptr;
      ptVar3[1] = (totally_ordered_wrapper<const_QAbstractItemModel_*>)uVar7;
      pCVar2 = pCVar4 + lVar5;
      (pCVar2->parent).r = iVar9;
      (pCVar2->parent).c = iVar10;
      (pCVar2->parent).i = qVar6;
      pqVar1 = &(this->super_QArrayDataPointer<QAbstractItemModelPrivate::Change>).size;
      *pqVar1 = *pqVar1 + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }